

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddError
          (ErrorPrinter *this,string *filename,int line,int column,string *message)

{
  allocator local_51;
  string local_50;
  
  this->found_errors_ = true;
  std::__cxx11::string::string((string *)&local_50,"error",&local_51);
  AddErrorOrWarning(this,filename,line,column,message,&local_50,(ostream *)&std::cerr);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void AddError(const string& filename, int line, int column,
                const string& message) {
    found_errors_ = true;
    AddErrorOrWarning(filename, line, column, message, "error", std::cerr);
  }